

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockableVector.hpp
# Opt level: O0

shared_ptr<LockedVector<int>_> __thiscall
LockableVector<int>::tryLockAndGet(LockableVector<int> *this)

{
  bool bVar1;
  LockedVector<int> *this_00;
  logic_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<LockedVector<int>_> sVar2;
  LockedVector<int> *in_stack_ffffffffffffffb8;
  mutex *in_stack_ffffffffffffffc0;
  
  bVar1 = std::mutex::try_lock(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"No lock acquired");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_00 = (LockedVector<int> *)operator_new(0x10);
  LockedVector<int>::LockedVector(this_00,in_RSI,(LockableVector<int> *)in_RSI);
  std::shared_ptr<LockedVector<int>>::shared_ptr<LockedVector<int>,void>
            ((shared_ptr<LockedVector<int>_> *)this_00,in_stack_ffffffffffffffb8);
  sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<LockedVector<int>_>)
         sVar2.super___shared_ptr<LockedVector<int>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LockedVector<T>> tryLockAndGet () {
		if (vectorMutex.try_lock ()) {
			return std::shared_ptr<LockedVector<T>> (new LockedVector<T> (dataVector, this));
		}
		throw std::logic_error ("No lock acquired");
	}